

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O0

RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
google::protobuf::internal::TcParser::
MaybeCreateRepeatedRefAt<google::protobuf::RepeatedPtrField<std::__cxx11::string>,true>
          (void *x,size_t offset,MessageLite *msg)

{
  void *pvVar1;
  void **ppvVar2;
  void *pvVar3;
  Arena *arena;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar4;
  void **ptr;
  MessageLite *msg_local;
  size_t offset_local;
  void *x_local;
  
  ppvVar2 = RefAt<void*>(x,offset);
  pvVar1 = *ppvVar2;
  pvVar3 = DefaultRawPtr();
  if (pvVar1 == pvVar3) {
    arena = MessageLite::GetArena(msg);
    pRVar4 = Arena::Create<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(arena);
    *ppvVar2 = pRVar4;
  }
  return (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)*ppvVar2;
}

Assistant:

static inline T& MaybeCreateRepeatedRefAt(void* x, size_t offset,
                                            MessageLite* msg) {
    if (!is_split) return RefAt<T>(x, offset);
    void*& ptr = RefAt<void*>(x, offset);
    if (ptr == DefaultRawPtr()) {
      ptr = Arena::Create<T>(msg->GetArena());
    }
    return *static_cast<T*>(ptr);
  }